

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::dataidx<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  uint *puVar3;
  Name *pNVar4;
  Lexer *this;
  allocator<char> local_a1;
  string local_a0;
  Err local_80;
  size_t local_58;
  char *local_50;
  Ok local_41;
  undefined1 local_40 [8];
  optional<wasm::Name> id;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> x;
  ParseModuleTypesCtx *ctx_local;
  
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_20);
  oVar1 = x;
  if (bVar2) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    NullInstrParserCtx::getDataFromIdx
              ((NullInstrParserCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,*puVar3);
    Result<wasm::Ok>::Result<wasm::Ok>
              (__return_storage_ptr__,
               (Ok *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>.field_0x17);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_40,
                  (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int> + 8));
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_40);
    oVar1 = x;
    if (bVar2) {
      pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_40);
      local_58 = (pNVar4->super_IString).str._M_len;
      local_50 = (pNVar4->super_IString).str._M_str;
      NullInstrParserCtx::getDataFromName
                ((NullInstrParserCtx *)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>,(Name)(pNVar4->super_IString).str);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_41);
    }
    else {
      this = (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int> + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"expected data index or identifier",&local_a1);
      Lexer::err(&local_80,this,&local_a0);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_80);
      wasm::Err::~Err(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataIdxT> dataidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getDataFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getDataFromName(*id);
  }
  return ctx.in.err("expected data index or identifier");
}